

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

string * __thiscall Apt::GetRwysString_abi_cxx11_(Apt *this)

{
  bool bVar1;
  ulong uVar2;
  pointer pRVar3;
  string *in_RDI;
  const_iterator i;
  string *s;
  vector<RwyEndPt,_std::allocator<RwyEndPt>_> *in_stack_ffffffffffffff98;
  __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_> local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_20._M_current =
       (RwyEndPt *)
       std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::cbegin(in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::cend(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI," / ");
    }
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
             ::operator->(&local_20);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&pRVar3->id);
    std::__cxx11::string::operator+=((string *)in_RDI,'-');
    in_stack_ffffffffffffffa0 =
         __gnu_cxx::
         __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>::
         operator++(&local_20);
    std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::cend(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                        *)in_stack_ffffffffffffff98);
    if (bVar1) {
      pRVar3 = __gnu_cxx::
               __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
               ::operator->(&local_20);
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)&pRVar3->id);
    }
    __gnu_cxx::
    __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>::
    operator++(&local_20);
  }
  return in_RDI;
}

Assistant:

std::string GetRwysString () const
    {
        std::string s;
        // loop all runways (the two ends of a rwy are always added together to the vector)
        for (vecRwyEndPtTy::const_iterator i = vecRwyEndPts.cbegin();
             i != vecRwyEndPts.cend();
             ++i)
        {
            if (!s.empty()) s += " / ";     // divider between runways
            s += i->id;                     // add ids of runways
            s += '-';
            if ((++i) != vecRwyEndPts.cend())
                s += i->id;
        }
        return s;
    }